

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_parse.cpp
# Opt level: O2

param * param_parse::parse(int argc,char **argv)

{
  char *__lhs;
  bool bVar1;
  run_param *prVar2;
  ostream *poVar3;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (argc != 1) {
    __lhs = argv[1];
    std::__cxx11::string::string((string *)&local_40,"run",&local_41);
    bVar1 = std::operator==(__lhs,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      prVar2 = run_param_parse::parse(argc,argv);
      return &prVar2->super_param;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"unsupport command: \'");
    poVar3 = std::operator<<(poVar3,argv[1]);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"please use: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," run --help");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

param *param_parse::parse(int argc, char *argv[]) {
  if (argc == 1) {
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }

  if (argv[1] == string("run")) {
    return run_param_parse::parse(argc, argv);
  } else {
    std::cerr << "unsupport command: '" << argv[1] << "'" << std::endl;
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }
}